

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O3

reentrant_put_transaction<void> * __thiscall
density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
start_reentrant_dyn_push_copy
          (reentrant_put_transaction<void> *__return_storage_ptr__,
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          *this,runtime_type *i_type,void *i_source)

{
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *pcVar1;
  int iVar2;
  reentrant_put_transaction<void> local_68;
  reentrant_put_transaction<void> local_48;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_reentrant_dyn_push_copy
              ((reentrant_put_transaction<void> *)&local_68,&this->m_queue,i_type,i_source);
    pcVar1 = local_68.m_queue;
    local_48.m_put_data.m_control_block = (ControlBlock *)local_68.m_put_transaction.m_queue;
    local_48.m_put_data.m_user_storage = local_68.m_put_transaction.m_put_data.m_control_block;
    local_68.m_queue =
         (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         0x0;
    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)&local_68);
    local_68.m_put_transaction.m_put_data.m_control_block = local_48.m_put_data.m_control_block;
    local_68.m_put_transaction.m_put_data.m_user_storage = local_48.m_put_data.m_user_storage;
    local_48.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
    __return_storage_ptr__->m_queue = this;
    (__return_storage_ptr__->m_put_transaction).m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)pcVar1;
    (__return_storage_ptr__->m_put_transaction).m_put_data.m_control_block =
         local_48.m_put_data.m_control_block;
    (__return_storage_ptr__->m_put_transaction).m_put_data.m_user_storage =
         local_48.m_put_data.m_user_storage;
    local_68.m_queue =
         (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         0x0;
    local_68.m_put_transaction.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
    reentrant_put_transaction<void>::~reentrant_put_transaction(&local_68);
    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<void>::~reentrant_put_transaction(&local_48);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

reentrant_put_transaction<>
          start_reentrant_dyn_push_copy(const runtime_type & i_type, const void * i_source)
        {
            std::lock_guard<std::mutex> lock(m_mutex);
            auto put_transaction = m_queue.start_reentrant_dyn_push_copy(i_type, i_source);
            return reentrant_put_transaction<>(PrivateType(), this, std::move(put_transaction));
        }